

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

void __thiscall Potassco::AspifTextInput::matchAtomArg(AspifTextInput *this)

{
  char cVar1;
  BufferedStream *pBVar2;
  int iVar3;
  
  iVar3 = 0;
  while( true ) {
    while( true ) {
      pBVar2 = ProgramReader::stream(&this->super_ProgramReader);
      cVar1 = pBVar2->buf_[pBVar2->rpos_];
      if (cVar1 != '\"') break;
      matchStr(this);
    }
    if (cVar1 == '\0') {
      return;
    }
    if (cVar1 == ')') {
      if (iVar3 < 1) {
        return;
      }
      iVar3 = iVar3 + -1;
    }
    if ((cVar1 == ',') && (iVar3 == 0)) break;
    iVar3 = iVar3 + (uint)(cVar1 == '(');
    pBVar2 = ProgramReader::stream(&this->super_ProgramReader);
    BufferedStream::get(pBVar2);
    std::__cxx11::string::_M_replace_aux
              ((ulong)&this->data_->symbol,(this->data_->symbol)._M_string_length,0,'\x01');
    pBVar2 = ProgramReader::stream(&this->super_ProgramReader);
    BufferedStream::skipWs(pBVar2);
  }
  return;
}

Assistant:

void AspifTextInput::matchAtomArg() {
	char c;
	for (int p = 0; (c = stream()->peek()) != 0; ) {
		if (c == '"') {
			matchStr();
		}
		else {
			if      (c == ')' && --p < 0) { break; }
			else if (c == ',' &&  p == 0) { break; }
			p += int(c == '(');
			push(stream()->get());
			skipws();
		}
	}
}